

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCRef * NULLC::CopyObject(NULLCRef ptr)

{
  uint size;
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  NULLCRef *in_RDI;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  NULLCRef *ret;
  uint objSize;
  
  in_RDI->typeID = in_stack_00000008;
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_RDI->typeID);
  size = pEVar1->size;
  pcVar2 = (char *)AllocObject(size,in_stack_00000008);
  in_RDI->ptr = pcVar2;
  memcpy(in_RDI->ptr,(void *)CONCAT124(ptr,in_stack_0000000c),(ulong)size);
  return in_RDI;
}

Assistant:

NULLCRef NULLC::CopyObject(NULLCRef ptr)
{
	NULLCRef ret;
	ret.typeID = ptr.typeID;
	unsigned int objSize = linker->exTypes[ret.typeID].size;
	ret.ptr = (char*)AllocObject(objSize, ptr.typeID);
	memcpy(ret.ptr, ptr.ptr, objSize);
	return ret;
}